

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrref.h
# Opt level: O2

void __thiscall StringRef::append_utf8(StringRef *this,wchar_t ch)

{
  undefined8 in_RAX;
  undefined1 uVar1;
  long lStack_10;
  undefined5 uStack_8;
  char buf [3];
  
  uVar1 = (undefined1)ch;
  buf._1_2_ = (undefined2)((ulong)in_RAX >> 0x30);
  uStack_8 = (undefined5)in_RAX;
  if (ch < L'\x80') {
    _uStack_8 = CONCAT15(uVar1,uStack_8);
    lStack_10 = 1;
  }
  else if ((uint)ch < 0x800) {
    buf[2] = (char)((ulong)in_RAX >> 0x38);
    _uStack_8 = CONCAT17(buf[2],CONCAT16(uVar1,CONCAT15((char)((uint)ch >> 6),uStack_8))) &
                0xff3fffffffffffff | 0x80c00000000000;
    lStack_10 = 2;
  }
  else {
    _uStack_8 = CONCAT17(uVar1,CONCAT16((char)((uint)ch >> 6),
                                        CONCAT15((char)((uint)ch >> 0xc),uStack_8))) &
                0x3f3f0fffffffffff | 0x8080e00000000000;
    lStack_10 = 3;
  }
  append(this,buf,lStack_10);
  return;
}

Assistant:

void append_utf8(wchar_t ch)
    {
        char buf[3];

        if (ch <= 0x7f)
        {
            /* it's in the range 0..7f - encode as one byte */
            buf[0] = (char)ch;
            append(buf, 1);
        }
        else if (ch <= 0x7ff)
        {
            /* it's in the range 80..7ff - encode as two bytes */
            buf[0] = (char)(0xC0 | ((ch >> 6) & 0x1F));
            buf[1] = (char)(0x80 | (ch & 0x3F));
            append(buf, 2);
        }
        else
        {
            /* it's in the range 800..ffff - encode as three bytes */
            buf[0] = (char)(0xE0 | ((ch >> 12) & 0x0F));
            buf[1] = (char)(0x80 | ((ch >> 6) & 0x3F));
            buf[2] = (char)(0x80 | (ch & 0x3F));
            append(buf, 3);
        }
    }